

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall
libtorrent::save_resume_data_failed_alert::~save_resume_data_failed_alert
          (save_resume_data_failed_alert *this)

{
  torrent_alert::~torrent_alert(&this->super_torrent_alert);
  operator_delete(this,0x40);
  return;
}

Assistant:

struct TORRENT_EXPORT save_resume_data_failed_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT save_resume_data_failed_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, error_code const& e);

		TORRENT_DEFINE_ALERT_PRIO(save_resume_data_failed_alert, 38, alert_priority::critical)

		static inline constexpr alert_category_t static_category = alert_category::storage
			| alert_category::error;
		std::string message() const override;

		// the error code from the resume_data failure
		error_code const error;

#if TORRENT_ABI_VERSION == 1
		TORRENT_DEPRECATED std::string msg;
#endif
	}